

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::PrepareFramebufferAuxiliary<2u>
          (StorageMultisampleTest *this,GLenum internal_format)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLuint GVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  undefined4 *puVar9;
  Functions *gl;
  GLenum internal_format_local;
  StorageMultisampleTest *this_local;
  long lVar8;
  
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar7->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar8 + 0x6d0))(1,&this->m_fbo_aux);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"glGenFramebuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xe50);
  (**(code **)(lVar8 + 0x6f8))(1,&this->m_to_aux);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"glGenRenderbuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xe53);
  (**(code **)(lVar8 + 0x78))(0x8d40,this->m_fbo_aux);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xe56);
  (**(code **)(lVar8 + 0xb8))(0xde1,this->m_to_aux);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"glBindRenderbuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xe59);
  pcVar1 = *(code **)(lVar8 + 0x1450);
  GVar6 = this->m_to_aux;
  GVar4 = TestReferenceDataWidth<2u>();
  GVar5 = TestReferenceDataHeight<2u>();
  (*pcVar1)(GVar6,1,internal_format,GVar4,GVar5);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"glTextureStorage2D call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xe5c);
  (**(code **)(lVar8 + 0x1360))(0xde1,0x2800,0x2600);
  (**(code **)(lVar8 + 0x1360))(0xde1,0x2801,0x2600);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"glTexParameteri call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xe61);
  (**(code **)(lVar8 + 0x6a0))(0x8d40,0x8ce0,0xde1,this->m_to_aux,0);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"glFramebufferRenderbuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xe64);
  iVar2 = (**(code **)(lVar8 + 0x170))(0x8d40);
  if (iVar2 != 0x8cd5) {
    puVar9 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar9 = 0;
    __cxa_throw(puVar9,&int::typeinfo,0);
  }
  pcVar1 = *(code **)(lVar8 + 0x1a00);
  GVar6 = TestReferenceDataWidth<2u>();
  GVar4 = TestReferenceDataHeight<2u>();
  (*pcVar1)(0,0,GVar6,GVar4);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"glViewport call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xe6c);
  (**(code **)(lVar8 + 0x1c0))(0,0,0);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"glClearColor call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xe70);
  (**(code **)(lVar8 + 0x188))(0x4000);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"glClear call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xe73);
  return;
}

Assistant:

void StorageMultisampleTest::PrepareFramebufferAuxiliary<2>(const glw::GLenum internal_format)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare framebuffer. */
	gl.genFramebuffers(1, &m_fbo_aux);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers call failed.");

	gl.genTextures(1, &m_to_aux);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_aux);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	gl.bindTexture(GL_TEXTURE_2D, m_to_aux);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer call failed.");

	gl.textureStorage2D(m_to_aux, 1, internal_format, TestReferenceDataWidth<2>(), TestReferenceDataHeight<2>());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureStorage2D call failed.");

	/* Parameter setup. */
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri call failed.");

	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_to_aux, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer call failed.");

	if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
	{
		throw 0;
	}

	gl.viewport(0, 0, TestReferenceDataWidth<2>(), TestReferenceDataHeight<2>());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport call failed.");

	/* Clear framebuffer's content. */
	gl.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor call failed.");

	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClear call failed.");
}